

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

void updateMatrix(vector<edge,_std::allocator<edge>_> *DFAedges,adjacencyType *RFAedges,
                 char **matrix)

{
  pointer peVar1;
  char *pcVar2;
  iterator iVar3;
  _Base_ptr p_Var4;
  ulong uVar5;
  long lVar6;
  pointer peVar7;
  value_type edgeRFA;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>
  local_60;
  
  peVar1 = (DFAedges->super__Vector_base<edge,_std::allocator<edge>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  peVar7 = (DFAedges->super__Vector_base<edge,_std::allocator<edge>_>)._M_impl.
           super__Vector_impl_data._M_start;
  if (peVar7 != peVar1) {
    uVar5 = (ulong)(uint)numOfStatesRFA;
    do {
      if (0 < (int)uVar5) {
        lVar6 = 0;
        do {
          std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>
          ::_Rb_tree(&local_60,
                     &(RFAedges->
                      super__Vector_base<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<int,_std::less<int>,_std::allocator<int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>,_std::allocator<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<int,_std::less<int>,_std::allocator<int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_start[lVar6]._M_t);
          iVar3 = std::
                  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>
                  ::find(&local_60,&peVar7->by);
          if ((_Rb_tree_header *)iVar3._M_node != &local_60._M_impl.super__Rb_tree_header) {
            p_Var4 = iVar3._M_node[2]._M_right;
            if (p_Var4 != (_Base_ptr)&iVar3._M_node[2]._M_parent) {
              pcVar2 = matrix[numOfStatesRFA * peVar7->from + (int)lVar6];
              do {
                pcVar2[(long)numOfStatesRFA * (long)peVar7->to + (long)(int)p_Var4[1]._M_color] =
                     '\x01';
                p_Var4 = (_Base_ptr)std::_Rb_tree_increment(p_Var4);
              } while (p_Var4 != (_Base_ptr)&iVar3._M_node[2]._M_parent);
            }
          }
          std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>
          ::~_Rb_tree(&local_60);
          uVar5 = (ulong)numOfStatesRFA;
          lVar6 = lVar6 + 1;
        } while (lVar6 < (long)uVar5);
      }
      peVar7 = peVar7 + 1;
    } while (peVar7 != peVar1);
  }
  return;
}

Assistant:

void updateMatrix(const vector<edge> & DFAedges,
                  const adjacencyType & RFAedges,
                  char ** matrix)
{
    // matrix indices -> DFA state X RFA state
    for (auto & edge : DFAedges) {
        for (auto fromRFA = 0;  fromRFA < numOfStatesRFA; ++ fromRFA) {
            auto edgeRFA = RFAedges[fromRFA];
            auto iter = edgeRFA.find(edge.by);
            if (iter != edgeRFA.end()) {
                // have edge(s) by this nonterm in new edges of DFA and RFA
                // need to add info about edge(s) to matrix
                int rowIndex = edge.from * numOfStatesRFA + fromRFA;
                char * matrixRow = matrix[rowIndex];
                for (auto toRFA : iter->second) {
                    int colIndex = edge.to * numOfStatesRFA + toRFA;
                    matrixRow[colIndex] = 1;
                }
            }
        }
    }
}